

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ushort uVar2;
  char *__s1;
  pointer pDVar3;
  double dVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined2 uVar7;
  UINT8 UVar8;
  undefined2 uVar9;
  PlayerBase *pPVar10;
  pointer pPVar11;
  undefined8 uVar12;
  UINT8 UVar13;
  byte bVar14;
  uint __i;
  UINT32 UVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  AUDIO_OPTS *pAVar21;
  VGMPlayer *pVVar22;
  S98Player *pSVar23;
  DROPlayer *pDVar24;
  GYMPlayer *pGVar25;
  Config *pCVar26;
  char *pcVar27;
  char *pcVar28;
  DATA_LOADER *loader;
  PlayerBase *pPVar29;
  S98_HEADER *pSVar30;
  VGM_HEADER *pVVar31;
  DRO_HEADER *pDVar32;
  undefined4 extraout_var;
  vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_> *pvVar33;
  AUDIO_OPTS *pAVar34;
  void *drvObj;
  ulong uVar35;
  _func_int **pp_Var36;
  UINT32 UVar37;
  UINT32 UVar38;
  size_type __new_size;
  char *pcVar39;
  FILE *pFVar40;
  FILE *drvStruct;
  int iVar41;
  long lVar42;
  byte *__nptr;
  DACSTRM_DEV *strmDev;
  undefined8 *puVar43;
  byte *pbVar44;
  byte *pbVar45;
  bool bVar46;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar47;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  byte *local_1d0;
  PlayerBase *local_1c8;
  allocator local_1b9;
  char *local_1b8;
  ulong local_1b0;
  vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> diList;
  char *local_180;
  PLR_DEV_OPTS devOpts;
  char *local_c8;
  char line [128];
  
  if (argc < 2) {
    printf("Usage: %s inputfile\n",*argv);
    return 0;
  }
  UVar38 = 0;
  OSMutex_Init(&renderMtx,'\0');
  puts("Opening Audio Device ...");
  UVar13 = Audio_Init();
  if (UVar13 != ' ') {
    UVar37 = 0xffffffff;
    UVar15 = Audio_GetDriverCount();
    iVar41 = 0;
    for (; UVar15 != UVar38; UVar38 = UVar38 + 1) {
      Audio_GetDriverInfo(UVar38,(AUDDRV_INFO **)&devOpts);
      if (*(char *)devOpts.emuCore == '\x01') {
        UVar37 = UVar38;
        if (iVar41 == -2) break;
        iVar41 = iVar41 + 1;
      }
    }
    if (UVar37 == 0xffffffff) {
      fwrite("Requested Audio Output driver not found!\n",0x29,1,_stderr);
    }
    else {
      audDrv = (void *)0x0;
      Audio_GetDriverInfo(UVar37,(AUDDRV_INFO **)line);
      printf("Using driver %s.\n",*(undefined8 *)(line._0_8_ + 8));
      bVar14 = AudioDrv_Init(UVar37,&audDrv);
      if (bVar14 == 0) {
        audDrvLog = (void *)0x0;
        if ((audDrv != (void *)0x0) &&
           (pAVar21 = AudioDrv_GetOptions(audDrv), pAVar21 != (AUDIO_OPTS *)0x0)) {
          pAVar21->sampleRate = 0xac44;
          pAVar21->numChannels = '\x02';
          pAVar21->numBitsPerSmpl = '\x10';
          if (audDrv == (void *)0x0) {
            __new_size = 0xac44;
            UVar38 = 0x2b11;
          }
          else {
            printf("Opening Device %u ...\n");
            bVar14 = AudioDrv_Start(audDrv,0);
            if (bVar14 != 0) {
              fprintf(_stderr,"Device Init Error: %02X\n",(ulong)bVar14);
              goto LAB_0010e6ea;
            }
            UVar38 = AudioDrv_GetBufferSize(audDrv);
            UVar38 = UVar38 >> 2;
            __new_size = 0;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&locAudBuf,__new_size);
          PlayerA::SetOutputSettings
                    (&mainPlr,pAVar21->sampleRate,pAVar21->numChannels,pAVar21->numBitsPerSmpl,
                     UVar38);
          playState = '\0';
          pVVar22 = (VGMPlayer *)operator_new(0x6a40);
          VGMPlayer::VGMPlayer(pVVar22);
          PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pVVar22);
          pSVar23 = (S98Player *)operator_new(0x1eb0);
          S98Player::S98Player(pSVar23);
          PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pSVar23);
          pDVar24 = (DROPlayer *)operator_new(0x3f8);
          DROPlayer::DROPlayer(pDVar24);
          PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pDVar24);
          pGVar25 = (GYMPlayer *)operator_new(0x330);
          GYMPlayer::GYMPlayer(pGVar25);
          PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pGVar25);
          PlayerA::SetEventCallback(&mainPlr,FilePlayCallback,(void *)0x0);
          PlayerA::SetFileReqCallback(&mainPlr,RequestFileCallback,(void *)0x0);
          PlayerA::SetLogCallback(&mainPlr,PlayerLogCallback,(void *)0x0);
          pCVar26 = PlayerA::GetConfiguration(&mainPlr);
          uVar5 = pCVar26->ignoreVolGain;
          uVar6 = pCVar26->chnInvert;
          uVar7 = *(undefined2 *)&pCVar26->field_0x6;
          devOpts.emuCore[1]._2_2_ = uVar7;
          devOpts.emuCore[1]._1_1_ = uVar6;
          devOpts.emuCore[1]._0_1_ = uVar5;
          devOpts.emuCore[0] = 0x10000;
          devOpts.srMode = '\x02';
          devOpts.resmplMode = '\0';
          devOpts._10_2_ = 0;
          devOpts.smplRate = 0x2b110;
          devOpts.muteOpts._0_4_ = SUB84((ulong)*(undefined8 *)&pCVar26->endSilenceSmpls >> 0x20,0);
          devOpts.coreOpts = 0x5622;
          devOpts.muteOpts.chnMute[0] = 0;
          devOpts.muteOpts.chnMute[1] = 0x3ff00000;
          PlayerA::SetConfiguration(&mainPlr,(Config *)&devOpts);
          uVar35 = 1;
          do {
            iVar41 = (int)uVar35;
            if (argc <= iVar41) {
              PlayerA::UnregisterAllPlayers(&mainPlr);
              if (audDrv != (void *)0x0) {
                AudioDrv_Stop(audDrv);
              }
              if (locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              }
              DeinitAudioSystem();
              puts("Done.");
              return 0;
            }
            pcVar39 = argv[iVar41];
            pcVar27 = strrchr(pcVar39,0x2f);
            pcVar28 = strrchr(pcVar39,0x5c);
            if (pcVar27 < pcVar28) {
              pcVar27 = pcVar28;
            }
            pcVar28 = pcVar27 + 1;
            if (pcVar27 == (char *)0x0) {
              pcVar28 = pcVar39;
            }
            printf("Loading %s ...  ",pcVar28);
            fflush(_stdout);
            loader = FileLoader_Init(argv[iVar41]);
            if (loader != (DATA_LOADER *)0x0) {
              DataLoader_SetPreloadBytes(loader,0x100);
              bVar14 = DataLoader_Load(loader);
              if ((bVar14 == 0) && (bVar14 = PlayerA::LoadFile(&mainPlr,loader), bVar14 == 0)) {
                pPVar29 = PlayerA::GetPlayer(&mainPlr);
                PlayerA::SetLoopCount(&mainPlr,2);
                iVar41 = (*pPVar29->_vptr_PlayerBase[2])(pPVar29);
                local_1b0 = uVar35;
                if (iVar41 == 0x53393800) {
                  pSVar23 = (S98Player *)
                            __dynamic_cast(pPVar29,&PlayerBase::typeinfo,&S98Player::typeinfo,0);
                  pSVar30 = S98Player::GetFileHeader(pSVar23);
                  bVar14 = pSVar30->fileVer;
                  uVar16 = (*pPVar29->_vptr_PlayerBase[0x1c])(pPVar29);
                  (*pPVar29->_vptr_PlayerBase[0x17])(pPVar29,(ulong)uVar16);
                  local_1b8 = (char *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                  uVar16 = (*pPVar29->_vptr_PlayerBase[0x1d])(pPVar29);
                  (*pPVar29->_vptr_PlayerBase[0x17])(pPVar29,(ulong)uVar16);
                  printf("S98 v%u, Total Length: %.2f s, Loop Length: %.2f s, Tick Rate: %u/%u",
                         (int)local_1b8,CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),
                         (ulong)bVar14,(ulong)pSVar30->tickMult);
                }
                else {
                  iVar41 = (*pPVar29->_vptr_PlayerBase[2])(pPVar29);
                  if (iVar41 == 0x56474d00) {
                    pVVar22 = (VGMPlayer *)
                              __dynamic_cast(pPVar29,&PlayerBase::typeinfo,&VGMPlayer::typeinfo,0);
                    pVVar31 = VGMPlayer::GetFileHeader(pVVar22);
                    uVar16 = pVVar31->fileVer;
                    uVar17 = (*pPVar29->_vptr_PlayerBase[0x1c])(pPVar29);
                    (*pPVar29->_vptr_PlayerBase[0x17])(pPVar29,(ulong)uVar17);
                    local_1b8 = (char *)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
                    uVar17 = (*pPVar29->_vptr_PlayerBase[0x1d])(pPVar29);
                    (*pPVar29->_vptr_PlayerBase[0x17])(pPVar29,(ulong)uVar17);
                    printf("VGM v%3X, Total Length: %.2f s, Loop Length: %.2f s",(int)local_1b8,
                           CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02),(ulong)uVar16);
                    UVar38 = VGMPlayer::GetModifiedLoopCount(pVVar22,2);
                    PlayerA::SetLoopCount(&mainPlr,UVar38);
                  }
                  else {
                    iVar41 = (*pPVar29->_vptr_PlayerBase[2])(pPVar29);
                    if (iVar41 == 0x44524f00) {
                      pDVar24 = (DROPlayer *)
                                __dynamic_cast(pPVar29,&PlayerBase::typeinfo,&DROPlayer::typeinfo,0)
                      ;
                      pDVar32 = DROPlayer::GetFileHeader(pDVar24);
                      pcVar39 = "unknown";
                      if ((ulong)pDVar32->hwType < 3) {
                        pcVar39 = &DAT_0016065c +
                                  *(int *)(&DAT_0016065c + (ulong)pDVar32->hwType * 4);
                      }
                      uVar2 = pDVar32->verMajor;
                      uVar16 = (*pPVar29->_vptr_PlayerBase[0x1c])(pPVar29);
                      (*pPVar29->_vptr_PlayerBase[0x17])(pPVar29,(ulong)uVar16);
                      printf("DRO v%u, Total Length: %.2f s, HW Type: %s",(ulong)uVar2,pcVar39);
                    }
                  }
                }
                local_1c8 = pPVar29;
                if (showTags != '\0') {
                  iVar41 = (*pPVar29->_vptr_PlayerBase[7])(pPVar29);
                  pcVar27 = (char *)0x0;
                  pcVar28 = (char *)0x0;
                  local_1b8 = (char *)0x0;
                  local_180 = (char *)0x0;
                  local_c8 = (char *)0x0;
                  pcVar39 = (char *)0x0;
                  for (puVar43 = (undefined8 *)(CONCAT44(extraout_var,iVar41) + 8);
                      __s1 = (char *)puVar43[-1], __s1 != (char *)0x0; puVar43 = puVar43 + 2) {
                    iVar41 = strcmp(__s1,"TITLE");
                    if (iVar41 == 0) {
                      pcVar39 = (char *)*puVar43;
                    }
                    else {
                      iVar41 = strcmp(__s1,"ARTIST");
                      if (iVar41 == 0) {
                        pcVar27 = (char *)*puVar43;
                      }
                      else {
                        iVar41 = strcmp(__s1,"GAME");
                        if (iVar41 == 0) {
                          pcVar28 = (char *)*puVar43;
                        }
                        else {
                          iVar41 = strcmp(__s1,"SYSTEM");
                          if (iVar41 == 0) {
                            local_1b8 = (char *)*puVar43;
                          }
                          else {
                            iVar41 = strcmp(__s1,"DATE");
                            if (iVar41 == 0) {
                              local_180 = (char *)*puVar43;
                            }
                            else {
                              iVar41 = strcmp(__s1,"COMMENT");
                              if (iVar41 == 0) {
                                local_c8 = (char *)*puVar43;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if ((pcVar39 != (char *)0x0) && (*pcVar39 != '\0')) {
                    printf("\nSong Title: %s",pcVar39);
                  }
                  pPVar29 = local_1c8;
                  if (1 < showTags) {
                    if ((pcVar27 != (char *)0x0) && (*pcVar27 != '\0')) {
                      printf("\nSong Author: %s",pcVar27);
                    }
                    if ((pcVar28 != (char *)0x0) && (*pcVar28 != '\0')) {
                      printf("\nSong Game: %s",pcVar28);
                    }
                    if ((local_1b8 != (char *)0x0) && (*local_1b8 != '\0')) {
                      printf("\nSong System: %s");
                    }
                    if ((local_180 != (char *)0x0) && (*local_180 != '\0')) {
                      printf("\nSong Date: %s",local_180);
                    }
                    if ((local_c8 != (char *)0x0) && (*local_c8 != '\0')) {
                      printf("\nSong Comment: %s",local_c8);
                    }
                  }
                }
                putchar(10);
                iVar41 = (*pPVar29->_vptr_PlayerBase[0xb])(pPVar29,0x80000000,&devOpts);
                if (-1 < (char)iVar41) {
                  if (devOpts.emuCore[0] == 0) {
                    devOpts.emuCore[0] = 0x4d41584d;
                  }
                  devOpts.panOpts.chnPan[0][0] = 0;
                  devOpts.panOpts.chnPan[0][1] = -0x80;
                  devOpts.panOpts.chnPan[0][2] = 0x80;
                  devOpts.panOpts.chnPan[0][3] = 0;
                  (*pPVar29->_vptr_PlayerBase[10])(pPVar29,0x80000000,&devOpts);
                }
                iVar41 = (*pPVar29->_vptr_PlayerBase[0xb])(pPVar29,0x80000001,&devOpts);
                if (-1 < (char)iVar41) {
                  devOpts.panOpts.chnPan[0][10] = 0x60;
                  devOpts.panOpts.chnPan[0][0xb] = 0;
                  devOpts.panOpts.chnPan[0][0xc] = -0xc0;
                  devOpts.panOpts.chnPan[0][0xd] = 0xc0;
                  devOpts.panOpts.chnPan[0][0] = -0x100;
                  devOpts.panOpts.chnPan[0][1] = 0x100;
                  devOpts.panOpts.chnPan[0][2] = -0x80;
                  devOpts.panOpts.chnPan[0][3] = 0x80;
                  devOpts.panOpts.chnPan[0][4] = -0x40;
                  devOpts.panOpts.chnPan[0][5] = 0x40;
                  devOpts.panOpts.chnPan[0][6] = -0xc0;
                  devOpts.panOpts.chnPan[0][7] = 0xc0;
                  devOpts.panOpts.chnPan[0][8] = 0;
                  devOpts.panOpts.chnPan[0][9] = -0x60;
                  (*pPVar29->_vptr_PlayerBase[10])(pPVar29,0x80000001,&devOpts);
                }
                iVar41 = (*pPVar29->_vptr_PlayerBase[0xb])(pPVar29,0x80000012,&devOpts);
                if (-1 < (char)iVar41) {
                  devOpts.panOpts.chnPan[0]._4_4_ = devOpts.panOpts.chnPan[0]._4_4_ & 0xffff0000;
                  devOpts.panOpts.chnPan[0][0] = -0x80;
                  devOpts.panOpts.chnPan[0][1] = 0x80;
                  (*pPVar29->_vptr_PlayerBase[10])(pPVar29,0x80000012,&devOpts);
                }
                iVar41 = (*pPVar29->_vptr_PlayerBase[0xb])(pPVar29,0x8000001b,&devOpts);
                if (-1 < (char)iVar41) {
                  if (devOpts.emuCore[0] == 0) {
                    devOpts.emuCore[0] = 0x4d414d45;
                  }
                  (*pPVar29->_vptr_PlayerBase[10])(pPVar29,0x8000001b,&devOpts);
                }
                PlayerA::Start(&mainPlr);
                if (showFileInfo == true) {
                  diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  (*pPVar29->_vptr_PlayerBase[8])(pPVar29,&devOpts);
                  (*pPVar29->_vptr_PlayerBase[9])(pPVar29,&diList);
                  FCC2Str_abi_cxx11_((string *)line,devOpts.emuCore[0]);
                  printf("SongInfo: %s v%X.%02X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",
                         line._0_8_,(ulong)devOpts.emuCore >> 0x20 & 0xffff,
                         (ulong)devOpts.emuCore >> 0x30,devOpts._8_8_ & 0xffffffff,
                         (ulong)devOpts._8_8_ >> 0x20,devOpts._16_8_ & 0xffffffff,
                         (ulong)devOpts._16_8_ >> 0x20,(ulong)devOpts.muteOpts.chnMute >> 0x20);
                  std::__cxx11::string::~string((string *)line);
                  lVar42 = 0x10;
                  pcVar39 = (char *)0x0;
                  while (pPVar11 = diList.
                                   super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                   _M_impl.super__Vector_impl_data._M_start,
                        pcVar39 < (char *)(((long)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)diList.
                                                 super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18))
                  {
                    uVar16 = *(uint *)((long)diList.
                                             super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      lVar42 + -0x10);
                    bVar14 = *(byte *)((long)diList.
                                             super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      lVar42 + -0xc);
                    cVar1 = *(char *)((long)diList.
                                            super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                     lVar42 + -0xb);
                    local_1b8 = pcVar39;
                    FCC2Str_abi_cxx11_((string *)line,
                                       *(UINT32 *)
                                        ((long)diList.
                                               super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                        lVar42 + -8));
                    printf(" Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
                           (ulong)uVar16,(ulong)bVar14,(ulong)(uint)(int)cVar1,line._0_8_,
                           (ulong)*(uint *)(*(long *)((long)&pPVar11->id + lVar42) + 8),
                           (ulong)*(uint *)((long)pPVar11 + lVar42 + -4),
                           (ulong)*(ushort *)((long)pPVar11 + lVar42 + -10));
                    std::__cxx11::string::~string((string *)line);
                    lVar42 = lVar42 + 0x18;
                    pcVar39 = local_1b8 + 1;
                  }
                  std::_Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::~_Vector_base
                            (&diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                            );
                  pPVar29 = local_1c8;
                }
                drvStruct = (FILE *)0x1;
                iVar41 = (*pPVar29->_vptr_PlayerBase[2])(pPVar29);
                if (iVar41 == 0x56474d00) {
                  pVVar22 = (VGMPlayer *)
                            __dynamic_cast(pPVar29,&PlayerBase::typeinfo,&VGMPlayer::typeinfo);
                  pvVar33 = VGMPlayer::GetStreamDevInfo(pVVar22);
                }
                else {
                  pvVar33 = (vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                             *)0x0;
                }
                if (audDrvLog != (void *)0x0) {
                  pAVar21 = AudioDrv_GetOptions(audDrvLog);
                  if (audDrv != (void *)0x0) {
                    pAVar34 = AudioDrv_GetOptions(audDrv);
                    UVar13 = pAVar34->numChannels;
                    UVar8 = pAVar34->numBitsPerSmpl;
                    uVar9 = *(undefined2 *)&pAVar34->field_0x6;
                    UVar38 = pAVar34->usecPerBuf;
                    UVar37 = pAVar34->numBuffers;
                    pAVar21->sampleRate = pAVar34->sampleRate;
                    pAVar21->numChannels = UVar13;
                    pAVar21->numBitsPerSmpl = UVar8;
                    *(undefined2 *)&pAVar21->field_0x6 = uVar9;
                    pAVar21->usecPerBuf = UVar38;
                    pAVar21->numBuffers = UVar37;
                  }
                  drvObj = AudioDrv_GetDrvData(audDrvLog);
                  WavWrt_SetFileName(drvObj,"waveOut.wav");
                  UVar13 = AudioDrv_Start(audDrvLog,0);
                  if (audDrv != (void *)0x0 && UVar13 == '\0') {
                    AudioDrv_DataForward_Add(audDrv,audDrvLog);
                  }
                }
                uVar16 = 1;
                local_1b8 = (char *)CONCAT71(local_1b8._1_7_,1);
                if (audDrv != (void *)0x0) {
                  UVar13 = AudioDrv_SetCallback(audDrv,FillBuffer,&mainPlr);
                  local_1b8 = (char *)CONCAT71(local_1b8._1_7_,UVar13 != '\0');
                }
                changemode('\x01');
                playState = playState & 0xfd;
LAB_0010d4ee:
                pFVar40 = (FILE *)0x1;
                if ((playState & 2) == 0) {
                  if ((byte)((playState & 4) >> 2 & ((byte)uVar16 ^ 1)) == 0) {
                    pcVar39 = "Paused";
                    if ((playState & 4) == 0) {
                      bVar14 = PlayerA::GetState(&mainPlr);
                      pcVar39 = "Finish ";
                      if ((bVar14 & 2) == 0) {
                        bVar14 = PlayerA::GetState(&mainPlr);
                        pcVar39 = "Fading ";
                        if ((bVar14 & 0x10) == 0) {
                          pcVar39 = "Playing";
                        }
                      }
                    }
                    if ((pvVar33 ==
                         (vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_> *)
                         0x0) || (pDVar3 = (pvVar33->
                                           super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                           )._M_impl.super__Vector_impl_data._M_start,
                                 pDVar3 == (pvVar33->
                                           super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                           )._M_impl.super__Vector_impl_data._M_finish)) {
                      local_1c8 = (PlayerBase *)PlayerA::GetCurTime(&mainPlr,pbTimeMode);
                      dVar4 = PlayerA::GetTotalTime(&mainPlr,pbTimeMode);
                      printf("%s %.2f / %.2f ...   \r",(int)local_1c8,dVar4,pcVar39);
                    }
                    else {
                      std::__cxx11::string::string((string *)&devOpts," ",(allocator *)line);
                      bVar14 = pDVar3->pbMode;
                      if ((bVar14 & 0x10) != 0) {
                        std::__cxx11::string::push_back((char)&devOpts);
                        bVar14 = pDVar3->pbMode;
                      }
                      if ((char)bVar14 < '\0') {
                        std::__cxx11::string::push_back((char)&devOpts);
                      }
                      if (devOpts._8_8_ == 1) {
                        std::__cxx11::string::assign((char *)&devOpts);
                      }
                      local_1c8 = (PlayerBase *)PlayerA::GetCurTime(&mainPlr,pbTimeMode);
                      dVar4 = PlayerA::GetTotalTime(&mainPlr,pbTimeMode);
                      printf("%s %.2f / %.2f [%02X / %02X at %4.1f KHz%s] ...     \r",(int)local_1c8
                             ,dVar4,(double)pDVar3->freq / 1000.0,pcVar39,
                             (ulong)(pDVar3->lastItem + 1),(ulong)pDVar3->maxItems,devOpts.emuCore);
                      std::__cxx11::string::~string((string *)&devOpts);
                    }
                    drvStruct = _stdout;
                    fflush(_stdout);
                  }
                  if (((char)local_1b8 == '\0') || ((playState & 4) != 0)) {
                    usleep(50000);
                  }
                  else {
                    UVar38 = FillBuffer(drvStruct,&mainPlr,
                                        (int)locAudBuf.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                        (int)locAudBuf.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                        locAudBuf.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                    AudioDrv_WriteData(audDrvLog,UVar38,
                                       locAudBuf.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                  }
                  line[0] = '\0';
                  line[1] = '\0';
                  line[2] = '\0';
                  line[3] = '\0';
                  line[4] = '\0';
                  line[5] = '\0';
                  line[6] = '\0';
                  line[7] = '\0';
                  line[8] = '\0';
                  line[9] = '\0';
                  line[10] = '\0';
                  line[0xb] = '\0';
                  line[0xc] = '\0';
                  line[0xd] = '\0';
                  line[0xe] = '\0';
                  line[0xf] = '\0';
                  for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 1) {
                    (devOpts.emuCore + lVar42 * 2)[0] = 0;
                    (devOpts.emuCore + lVar42 * 2)[1] = 0;
                  }
                  devOpts.emuCore = (UINT32  [2])((ulong)devOpts.emuCore | 1);
                  select(1,(fd_set *)&devOpts,(fd_set *)0x0,(fd_set *)0x0,(timeval *)line);
                  uVar16 = devOpts.emuCore[0] & 1;
                  drvStruct = pFVar40;
                  if (((ulong)devOpts.emuCore & 1) != 0) {
                    uVar17 = getchar();
                    drvStruct = (FILE *)(ulong)uVar17;
                    uVar18 = toupper(uVar17);
                    if (uVar18 != 0x20) {
                      if (uVar18 == 0x52) {
                        OSMutex_Lock(renderMtx);
                        PlayerA::Reset(&mainPlr);
                      }
                      else {
                        if (uVar18 == 0x50) goto LAB_0010d72e;
                        if (9 < uVar18 - 0x30) {
                          if (uVar18 == 0x4e) {
                            if ((int)local_1b0 + 1 < argc) {
                              playState = playState | 2;
                            }
                          }
                          else if (uVar18 == 0x42) {
                            if (1 < (int)local_1b0) {
                              playState = playState | 2;
                              local_1b0 = (ulong)((int)local_1b0 - 2);
                            }
                          }
                          else if (uVar17 == 0x1b || uVar18 == 0x51) {
                            playState = playState | 2;
                            local_1b0 = (ulong)(argc - 1);
                          }
                          else if (uVar18 == 0x43) {
                            iVar41 = 0;
                            changemode('\0');
                            pPVar29 = PlayerA::GetPlayer(&mainPlr);
                            printf("Command Mode. ");
                            local_1c8 = (PlayerBase *)0xffffffffffffffff;
LAB_0010d8e6:
                            if (-1 < iVar41) {
                              if (iVar41 == 1) {
                                iVar41 = (*pPVar29->_vptr_PlayerBase[0xb])
                                                   (pPVar29,local_1c8,&devOpts);
                                if ((char)iVar41 < '\0') {
                                  iVar41 = 0;
                                  goto LAB_0010d8e6;
                                }
                                printf("Command [C/LC/O/SRM/SR/RSM/M data]: ");
                                pbVar44 = (byte *)line;
                                fgets((char *)pbVar44,0x80,_stdin);
                                StripNewline((char *)pbVar44);
                                strtok((char *)pbVar44," ");
                                for (; *pbVar44 != 0; pbVar44 = pbVar44 + 1) {
                                  iVar41 = toupper((uint)*pbVar44);
                                  *pbVar44 = (byte)iVar41;
                                }
                                pbVar45 = pbVar44 + 1;
                                uVar9 = line._0_2_;
                                local_1d0 = pbVar44;
                                if (line._0_2_ == 0x43) {
                                  std::__cxx11::string::string
                                            ((string *)&diList,(char *)pbVar45,&local_1b9);
                                  std::__cxx11::string::resize((ulong)&diList,'\x04');
                                  devOpts.emuCore[0] =
                                       (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 3
                                                  ) |
                                       (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 2
                                                  ) << 8 |
                                       (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 1
                                                  ) << 0x10 |
                                       (uint)(byte)(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id <<
                                       0x18;
                                  (*pPVar29->_vptr_PlayerBase[10])(pPVar29,local_1c8,&devOpts);
                                }
                                else {
                                  iVar41 = bcmp(line,"LC",3);
                                  uVar12 = line._0_8_;
                                  if (iVar41 != 0) {
                                    if (uVar9 == 0x4f) {
                                      uVar35 = strtoul((char *)pbVar45,(char **)&local_1d0,0);
                                      devOpts.coreOpts = (UINT32)uVar35;
                                    }
                                    else {
                                      uVar47 = line._0_4_;
                                      if (line._0_4_ == 0x4d5253) {
                                        uVar35 = strtoul((char *)pbVar45,(char **)&local_1d0,0);
                                        devOpts.srMode = (UINT8)uVar35;
                                      }
                                      else {
                                        iVar41 = bcmp(line,"SR",3);
                                        pPVar10 = local_1c8;
                                        if (iVar41 == 0) {
                                          uVar35 = strtoul((char *)pbVar45,(char **)&local_1d0,0);
                                          devOpts.smplRate = (UINT32)uVar35;
                                        }
                                        else {
                                          if (uVar47 != 0x4d5352) {
                                            if ((short)uVar12 != 0x50) {
                                              if ((uVar47 & 0xffff) == 0x4d) {
                                                while (pbVar44 = (byte *)strtok((char *)0x0,","),
                                                      pbVar44 != (byte *)0x0) {
                                                  iVar41 = toupper((uint)*pbVar44);
                                                  if (iVar41 == 0x44) {
                                                    devOpts.muteOpts.disable = 0xff;
                                                  }
                                                  else if (iVar41 == 0x58) {
                                                    devOpts.muteOpts.chnMute[0] = 0xffffffff;
                                                  }
                                                  else if (iVar41 == 0x4f) {
                                                    devOpts.muteOpts.chnMute =
                                                         (UINT32  [2])
                                                         ((ulong)devOpts.muteOpts.chnMute[1] << 0x20
                                                         );
                                                  }
                                                  else if (iVar41 == 0x45) {
                                                    devOpts.muteOpts.disable = '\0';
                                                  }
                                                  else {
                                                    iVar41 = isalnum(iVar41);
                                                    if ((iVar41 != 0) &&
                                                       (lVar42 = strtol((char *)pbVar44,
                                                                        (char **)&local_1d0,0),
                                                       pbVar44 < local_1d0)) {
                                                      devOpts.muteOpts.chnMute[0] =
                                                           devOpts.muteOpts.chnMute[0] ^
                                                           1 << ((byte)lVar42 & 0x1f);
                                                    }
                                                  }
                                                }
                                                (*pPVar29->_vptr_PlayerBase[0xc])
                                                          (pPVar29,(ulong)pPVar10 & 0xffffffff,
                                                           &devOpts.muteOpts);
                                                pcVar39 = 
                                                "-> Chip %s [0x%02X], Channel Mask: 0x%02X\n";
                                                goto LAB_0010da17;
                                              }
                                              bVar46 = (short)uVar12 == 0x51;
                                              goto LAB_0010e0aa;
                                            }
                                            iVar41 = 0;
                                            pbVar44 = (byte *)strtok((char *)0x0,",");
                                            for (uVar35 = 0;
                                                (pbVar44 != (byte *)0x0 && (uVar35 < 0x20));
                                                uVar35 = uVar35 + 1) {
                                              dVar4 = strtod((char *)pbVar44,(char **)&local_1d0);
                                              if (pbVar44 < local_1d0) {
                                                devOpts.panOpts.chnPan[0][uVar35] =
                                                     (INT16)(int)(dVar4 * 256.0);
                                              }
                                              pbVar44 = (byte *)strtok((char *)0x0,",");
                                              iVar41 = iVar41 + 1;
                                            }
                                            (*pPVar29->_vptr_PlayerBase[10])
                                                      (pPVar29,local_1c8,&devOpts);
                                            printf("-> Panning: ");
                                            while (bVar46 = iVar41 != 0, iVar41 = iVar41 + -1,
                                                  bVar46) {
                                              printf("%.2f,",SUB84((double)((float)(int)devOpts.
                                                  panOpts.chnPan[0][uVar35] * 0.00390625),0));
                                            }
                                            puts("\b ");
                                            iVar41 = 1;
                                            goto LAB_0010d8e6;
                                          }
                                          uVar35 = strtoul((char *)pbVar45,(char **)&local_1d0,0);
                                          devOpts.resmplMode = (UINT8)uVar35;
                                        }
                                      }
                                    }
                                    iVar41 = 1;
                                    if (pbVar45 < local_1d0) {
                                      (*pPVar29->_vptr_PlayerBase[10])(pPVar29,local_1c8,&devOpts);
                                      iVar41 = 1;
                                    }
                                    goto LAB_0010d8e6;
                                  }
                                  std::__cxx11::string::string
                                            ((string *)&diList,(char *)pbVar45,&local_1b9);
                                  std::__cxx11::string::resize((ulong)&diList,'\x04');
                                  devOpts.emuCore[1] =
                                       (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 3
                                                  ) |
                                       (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 2
                                                  ) << 8 |
                                       (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 1
                                                  ) << 0x10 |
                                       (uint)(byte)(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id <<
                                       0x18;
                                  (*pPVar29->_vptr_PlayerBase[10])(pPVar29,local_1c8,&devOpts);
                                }
                                std::__cxx11::string::~string((string *)&diList);
                                iVar41 = 1;
                                goto LAB_0010d8e6;
                              }
                              if (iVar41 == 10) {
                                printf("Command [T/FI/LL/TD data]: ");
                                fgets(line,0x80,_stdin);
                                StripNewline(line);
                                strtok(line," ");
                                pbVar44 = (byte *)line;
                                while( true ) {
                                  pbVar44 = pbVar44 + 1;
                                  if (pbVar44[-1] == 0) break;
                                  iVar41 = toupper((uint)pbVar44[-1]);
                                  pbVar44[-1] = (byte)iVar41;
                                }
                                local_1d0 = pbVar44 + -1;
                                uVar9 = line._0_2_;
                                if ((line._0_2_ != 0x54) &&
                                   (iVar41 = bcmp(line,"FI",3), iVar41 != 0)) {
                                  iVar41 = bcmp(line,"LL",3);
                                  if (iVar41 == 0) {
                                    uVar35 = strtoul((char *)pbVar44,(char **)&local_1d0,0);
                                    iVar41 = 10;
                                    if (pbVar44 < local_1d0) {
                                      logLevel = (UINT8)uVar35;
                                    }
                                  }
                                  else {
                                    iVar41 = bcmp(line,"TD",3);
                                    if (iVar41 == 0) {
                                      uVar35 = strtoul((char *)pbVar44,(char **)&local_1d0,0);
                                      iVar41 = 10;
                                      if (pbVar44 < local_1d0) {
                                        pbTimeMode = (UINT8)uVar35;
                                      }
                                    }
                                    else {
                                      bVar46 = uVar9 == 0x51;
LAB_0010e0aa:
                                      iVar41 = -(uint)bVar46;
                                    }
                                  }
                                  goto LAB_0010d8e6;
                                }
                                lVar42 = strtol((char *)pbVar44,(char **)&local_1d0,0);
                                iVar19 = (int)lVar42;
                                pbVar45 = pbVar44;
                                if (pbVar44 == local_1d0) {
                                  for (; local_1d0 = pbVar45, *pbVar45 != 0; pbVar45 = pbVar45 + 1)
                                  {
                                    iVar41 = toupper((uint)*pbVar45);
                                    *pbVar45 = (byte)iVar41;
                                  }
                                  bVar14 = *pbVar44;
                                  if (bVar14 != 0x44) {
                                    iVar19 = 1;
                                    if ((bVar14 == 0x45) ||
                                       (((bVar14 == 0x4f && (pbVar44[1] == 0x4e)) &&
                                        (iVar19 = 1, pbVar44[2] == 0)))) goto LAB_0010de1a;
                                    iVar19 = strcmp((char *)pbVar44,"OFF");
                                    iVar41 = 10;
                                    if (iVar19 != 0) goto LAB_0010d8e6;
                                  }
                                  iVar19 = 0;
                                }
                                else {
                                  iVar41 = 10;
                                  if (iVar19 < 0) goto LAB_0010d8e6;
                                }
LAB_0010de1a:
                                if (line._0_2_ == 0x54) {
                                  showTags = (UINT8)iVar19;
                                  iVar41 = 10;
                                }
                                else {
                                  iVar20 = bcmp(line,"FI",3);
                                  iVar41 = 10;
                                  if (iVar20 == 0) {
                                    showFileInfo = iVar19 != 0;
                                  }
                                }
                                goto LAB_0010d8e6;
                              }
                              if (iVar41 != 2) {
                                if (iVar41 == 0) {
                                  printf("Sound Chip ID: ");
                                  fgets(line,0x80,_stdin);
                                  StripNewline(line);
                                  if (line[0] == '\0') goto LAB_0010e57b;
                                  local_1c8 = (PlayerBase *)strtoul(line,(char **)&local_1d0,0);
                                  if (line < local_1d0) {
                                    iVar41 = (*pPVar29->_vptr_PlayerBase[0xb])
                                                       (pPVar29,(ulong)local_1c8 & 0xffffffff,
                                                        &devOpts);
                                    if (-1 < (char)iVar41) {
                                      FCC2Str_abi_cxx11_((string *)&diList,devOpts.emuCore[0]);
                                      printf("Cfg: Core %s, Opts 0x%X, srMode 0x%02X, sRate %u, resampleMode 0x%02X\n"
                                             ,diList.
                                              super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                             devOpts._16_8_ & 0xffffffff,devOpts._8_8_ & 0xff,
                                             (ulong)devOpts._8_8_ >> 0x20,
                                             (ulong)devOpts._8_8_ >> 8 & 0xff);
                                      std::__cxx11::string::~string((string *)&diList);
                                      pcVar39 = "Muting: Chip %s [0x%02X], Channel Mask: 0x%02X\n";
LAB_0010da17:
                                      iVar41 = 1;
                                      printf(pcVar39);
                                      goto LAB_0010d8e6;
                                    }
                                    pcVar39 = "Invalid sound chip ID.";
LAB_0010e0c5:
                                    puts(pcVar39);
                                  }
                                  else {
                                    iVar19 = toupper((uint)(byte)line[0]);
                                    iVar41 = 10;
                                    if (iVar19 == 0x44) goto LAB_0010d8e6;
                                    if (iVar19 == 0x50) {
                                      iVar19 = (*pPVar29->_vptr_PlayerBase[2])(pPVar29);
                                      if (iVar19 == 0x56474d00) {
                                        pVVar22 = (VGMPlayer *)
                                                  __dynamic_cast(pPVar29,&PlayerBase::typeinfo,
                                                                 &VGMPlayer::typeinfo);
                                        VGMPlayer::GetPlayerOptions
                                                  (pVVar22,(VGM_PLAY_OPTIONS *)&diList);
                                        printf("Opts: Speed %.3f, PlaybkHz %u, HardStopOld %u\n",
                                               SUB84((double)((ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffff) * 1.52587890625e-05,0),
                                               (ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 0x20,
                                               (ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish & 0xff)
                                        ;
                                        iVar41 = 2;
                                        goto LAB_0010d8e6;
                                      }
                                      if (iVar19 == 0x47594d00) {
                                        pGVar25 = (GYMPlayer *)
                                                  __dynamic_cast(pPVar29,&PlayerBase::typeinfo,
                                                                 &GYMPlayer::typeinfo);
                                        GYMPlayer::GetPlayerOptions
                                                  (pGVar25,(GYM_PLAY_OPTIONS *)&diList);
                                      }
                                      else {
                                        if (iVar19 != 0x53393800) {
                                          iVar41 = 0;
                                          if (iVar19 == 0x44524f00) {
                                            pDVar24 = (DROPlayer *)
                                                      __dynamic_cast(pPVar29,&PlayerBase::typeinfo,
                                                                     &DROPlayer::typeinfo);
                                            DROPlayer::GetPlayerOptions
                                                      (pDVar24,(DRO_PLAY_OPTIONS *)&diList);
                                            printf("Opts: Speed %.3f, OPL3Mode %u\n",
                                                   SUB84((double)((ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffff) * 1.52587890625e-05,0));
                                            iVar41 = 2;
                                          }
                                          goto LAB_0010d8e6;
                                        }
                                        pSVar23 = (S98Player *)
                                                  __dynamic_cast(pPVar29,&PlayerBase::typeinfo,
                                                                 &S98Player::typeinfo);
                                        S98Player::GetPlayerOptions
                                                  (pSVar23,(S98_PLAY_OPTIONS *)&diList);
                                      }
                                      printf("Opts: Speed %.3f\n",
                                             SUB84((double)((ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffff) * 1.52587890625e-05,0));
                                      iVar41 = 2;
                                      goto LAB_0010d8e6;
                                    }
                                  }
                                  iVar41 = 0;
                                }
                                goto LAB_0010d8e6;
                              }
                              iVar41 = (*pPVar29->_vptr_PlayerBase[2])(pPVar29);
                              if (iVar41 != 0x56474d00) {
                                pbVar45 = (byte *)line;
                                if (iVar41 == 0x47594d00) {
                                  pVVar22 = (VGMPlayer *)
                                            __dynamic_cast(pPVar29,&PlayerBase::typeinfo,
                                                           &GYMPlayer::typeinfo);
                                  GYMPlayer::GetPlayerOptions
                                            ((GYMPlayer *)pVVar22,(GYM_PLAY_OPTIONS *)&devOpts);
                                  printf("Command [SPD data]: ");
                                  fgets((char *)pbVar45,0x80,_stdin);
                                  StripNewline((char *)pbVar45);
                                  strtok((char *)pbVar45," ");
                                  for (; *pbVar45 != 0; pbVar45 = pbVar45 + 1) {
                                    iVar41 = toupper((uint)*pbVar45);
                                    *pbVar45 = (byte)iVar41;
                                  }
LAB_0010df65:
                                  local_1d0 = pbVar45;
                                  if (line._0_4_ != 0x445053) {
LAB_0010e0a4:
                                    bVar46 = (short)line._0_4_ == 0x51;
                                    goto LAB_0010e0aa;
                                  }
                                  pbVar45 = pbVar45 + 1;
LAB_0010df7f:
                                  dVar4 = strtod((char *)pbVar45,(char **)&local_1d0);
                                  uVar47 = SUB84(dVar4,0);
                                  iVar41 = 2;
                                  if (local_1d0 <= pbVar45) goto LAB_0010d8e6;
                                  pp_Var36 = (pVVar22->super_PlayerBase)._vptr_PlayerBase;
                                }
                                else {
                                  if (iVar41 == 0x53393800) {
                                    pVVar22 = (VGMPlayer *)
                                              __dynamic_cast(pPVar29,&PlayerBase::typeinfo,
                                                             &S98Player::typeinfo);
                                    S98Player::GetPlayerOptions
                                              ((S98Player *)pVVar22,(S98_PLAY_OPTIONS *)&devOpts);
                                    printf("Command [SPD data]: ");
                                    fgets((char *)pbVar45,0x80,_stdin);
                                    StripNewline((char *)pbVar45);
                                    strtok((char *)pbVar45," ");
                                    for (; *pbVar45 != 0; pbVar45 = pbVar45 + 1) {
                                      iVar41 = toupper((uint)*pbVar45);
                                      *pbVar45 = (byte)iVar41;
                                    }
                                    goto LAB_0010df65;
                                  }
                                  if (iVar41 != 0x44524f00) {
                                    pcVar39 = "No player-specific configuration available.";
                                    goto LAB_0010e0c5;
                                  }
                                  pVVar22 = (VGMPlayer *)
                                            __dynamic_cast(pPVar29,&PlayerBase::typeinfo,
                                                           &DROPlayer::typeinfo);
                                  DROPlayer::GetPlayerOptions
                                            ((DROPlayer *)pVVar22,(DRO_PLAY_OPTIONS *)&devOpts);
                                  printf("Command [SPD/OPL3 data]: ");
                                  fgets((char *)pbVar45,0x80,_stdin);
                                  StripNewline((char *)pbVar45);
                                  strtok((char *)pbVar45," ");
                                  for (pbVar44 = pbVar45; uVar12 = line._0_8_, *pbVar44 != 0;
                                      pbVar44 = pbVar44 + 1) {
                                    iVar41 = toupper((uint)*pbVar44);
                                    *pbVar44 = (byte)iVar41;
                                  }
                                  __nptr = pbVar44 + 1;
                                  local_1d0 = pbVar44;
                                  if (line._0_4_ != 0x445053) {
                                    iVar41 = bcmp(pbVar45,"OPL3",5);
                                    if (iVar41 != 0) {
                                      bVar46 = (short)uVar12 == 0x51;
                                      goto LAB_0010e0aa;
                                    }
                                    uVar35 = strtoul((char *)__nptr,(char **)&local_1d0,0);
                                    devOpts.emuCore[1]._0_1_ = (char)uVar35;
                                    iVar41 = 2;
                                    if (__nptr < local_1d0) {
                                      DROPlayer::SetPlayerOptions
                                                ((DROPlayer *)pVVar22,(DRO_PLAY_OPTIONS *)&devOpts);
                                      iVar41 = 2;
                                    }
                                    goto LAB_0010d8e6;
                                  }
                                  dVar4 = strtod((char *)__nptr,(char **)&local_1d0);
                                  uVar47 = SUB84(dVar4,0);
                                  iVar41 = 2;
                                  if (local_1d0 <= __nptr) goto LAB_0010d8e6;
                                  pp_Var36 = (pVVar22->super_PlayerBase)._vptr_PlayerBase;
                                }
                                (*pp_Var36[0x11])(uVar47,pVVar22);
                                iVar41 = 2;
                                goto LAB_0010d8e6;
                              }
                              pVVar22 = (VGMPlayer *)
                                        __dynamic_cast(pPVar29,&PlayerBase::typeinfo,
                                                       &VGMPlayer::typeinfo);
                              VGMPlayer::GetPlayerOptions(pVVar22,(VGM_PLAY_OPTIONS *)&devOpts);
                              printf("Command [SPD/PHZ/HSO data]: ");
                              pbVar44 = (byte *)line;
                              fgets((char *)pbVar44,0x80,_stdin);
                              StripNewline((char *)pbVar44);
                              strtok((char *)pbVar44," ");
                              for (; *pbVar44 != 0; pbVar44 = pbVar44 + 1) {
                                iVar41 = toupper((uint)*pbVar44);
                                *pbVar44 = (byte)iVar41;
                              }
                              pbVar45 = pbVar44 + 1;
                              local_1d0 = pbVar44;
                              if (line._0_4_ != 0x5a4850) {
                                if (line._0_4_ == 0x4f5348) {
                                  uVar35 = strtoul((char *)pbVar45,(char **)&local_1d0,0);
                                  devOpts.srMode = (UINT8)uVar35;
                                  goto joined_r0x0010e260;
                                }
                                if (line._0_4_ != 0x445053) goto LAB_0010e0a4;
                                goto LAB_0010df7f;
                              }
                              uVar35 = strtoul((char *)pbVar45,(char **)&local_1d0,0);
                              devOpts.emuCore[1] = (UINT32)uVar35;
joined_r0x0010e260:
                              iVar41 = 2;
                              if (pbVar45 < local_1d0) {
                                VGMPlayer::SetPlayerOptions(pVVar22,(VGM_PLAY_OPTIONS *)&devOpts);
                                iVar41 = 2;
                              }
                              goto LAB_0010d8e6;
                            }
LAB_0010e57b:
                            drvStruct = (FILE *)0x1;
                            changemode('\x01');
                          }
                          else if (uVar18 == 0x46) {
                            OSMutex_Lock(renderMtx);
                            PlayerA::FadeOut(&mainPlr);
                            drvStruct = (FILE *)renderMtx;
                            OSMutex_Unlock(renderMtx);
                          }
                          goto LAB_0010d4ee;
                        }
                        OSMutex_Lock(renderMtx);
                        pPVar29 = PlayerA::GetPlayer(&mainPlr);
                        iVar41 = (*pPVar29->_vptr_PlayerBase[0x1e])(pPVar29,2);
                        PlayerA::Seek(&mainPlr,'\x01',(iVar41 * (uVar18 & 0xf)) / 10);
                      }
                      drvStruct = (FILE *)renderMtx;
                      OSMutex_Unlock(renderMtx);
                      goto LAB_0010d4ee;
                    }
LAB_0010d72e:
                    playState = playState ^ 4;
                    drvStruct = (FILE *)audDrv;
                    if (audDrv != (void *)0x0) {
                      if ((playState & 4) == 0) {
                        AudioDrv_Resume(audDrv);
                      }
                      else {
                        AudioDrv_Pause(audDrv);
                      }
                    }
                  }
                  goto LAB_0010d4ee;
                }
                changemode('\0');
                if (audDrv != (void *)0x0) {
                  AudioDrv_SetCallback(audDrv,(AUDFUNC_FILLBUF)0x0,(void *)0x0);
                }
                uVar35 = local_1b0;
                if (audDrvLog != (void *)0x0) {
                  if (audDrv != (void *)0x0) {
                    AudioDrv_DataForward_Remove(audDrv,audDrvLog);
                  }
                  AudioDrv_Stop(audDrvLog);
                }
                PlayerA::Stop(&mainPlr);
                PlayerA::UnloadFile(&mainPlr);
                DataLoader_Deinit(loader);
              }
              else {
                DataLoader_Deinit(loader);
                fprintf(_stderr,"Error 0x%02X loading file!\n",(ulong)bVar14);
              }
            }
            uVar35 = (ulong)((int)uVar35 + 1);
          } while( true );
        }
LAB_0010e6ea:
        DeinitAudioSystem();
        return 1;
      }
      fprintf(_stderr,"WaveOut: Driver Init Error: %02X\n",(ulong)bVar14);
    }
    Audio_Deinit();
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
	int argbase;
	UINT8 retVal;
	DATA_LOADER *dLoad;
	int curSong;
	bool needRefresh;
	
	if (argc < 2)
	{
		printf("Usage: %s inputfile\n", argv[0]);
		return 0;
	}
	argbase = 1;
#ifdef _WIN32
	SetConsoleOutputCP(65001);	// set UTF-8 codepage
#endif
	
	retVal = InitAudioSystem();
	if (retVal)
		return 1;
	retVal = StartAudioDevice();
	if (retVal)
	{
		DeinitAudioSystem();
		return 1;
	}
	playState = 0x00;
	
	// I'll keep the instances of the players for the program's life time.
	// This way player/chip options are kept between track changes.
	mainPlr.RegisterPlayerEngine(new VGMPlayer);
	mainPlr.RegisterPlayerEngine(new S98Player);
	mainPlr.RegisterPlayerEngine(new DROPlayer);
	mainPlr.RegisterPlayerEngine(new GYMPlayer);
	mainPlr.SetEventCallback(FilePlayCallback, NULL);
	mainPlr.SetFileReqCallback(RequestFileCallback, NULL);
	mainPlr.SetLogCallback(PlayerLogCallback, NULL);
	//mainPlr.SetOutputSettings() is done in StartAudioDevice()
	{
		PlayerA::Config pCfg = mainPlr.GetConfiguration();
		pCfg.masterVol = masterVol;
		pCfg.loopCount = maxLoops;
		pCfg.fadeSmpls = sampleRate * 4;	// fade over 4 seconds
		pCfg.endSilenceSmpls = sampleRate / 2;	// 0.5 seconds of silence at the end
		pCfg.pbSpeed = 1.0;
		mainPlr.SetConfiguration(pCfg);
	}

	for (curSong = argbase; curSong < argc; curSong ++)
	{
	
	printf("Loading %s ...  ", GetFileTitle(argv[curSong]));
	fflush(stdout);

#ifdef USE_MEMORY_LOADER
	UINT32 fileSize;
	UINT8 *fileData = SlurpFile(argv[curSong],&fileSize);
	dLoad = MemoryLoader_Init(fileData, fileSize);
#else
	dLoad = FileLoader_Init(argv[curSong]);
#endif

	if(dLoad == NULL) continue;
	DataLoader_SetPreloadBytes(dLoad,0x100);
	retVal = DataLoader_Load(dLoad);
	if (retVal)
	{
		DataLoader_Deinit(dLoad);
		fprintf(stderr, "Error 0x%02X loading file!\n", retVal);
		continue;
	}
	retVal = mainPlr.LoadFile(dLoad);
	if (retVal)
	{
		DataLoader_Deinit(dLoad);
		fprintf(stderr, "Error 0x%02X loading file!\n", retVal);
		continue;
	}
	
	PlayerBase* player = mainPlr.GetPlayer();
	mainPlr.SetLoopCount(maxLoops);
	if (player->GetPlayerType() == FCC_S98)
	{
		S98Player* s98play = dynamic_cast<S98Player*>(player);
		const S98_HEADER* s98hdr = s98play->GetFileHeader();
		
		printf("S98 v%u, Total Length: %.2f s, Loop Length: %.2f s, Tick Rate: %u/%u", s98hdr->fileVer,
				player->Tick2Second(player->GetTotalTicks()), player->Tick2Second(player->GetLoopTicks()),
				s98hdr->tickMult, s98hdr->tickDiv);
	}
	else if (player->GetPlayerType() == FCC_VGM)
	{
		VGMPlayer* vgmplay = dynamic_cast<VGMPlayer*>(player);
		const VGM_HEADER* vgmhdr = vgmplay->GetFileHeader();
		
		printf("VGM v%3X, Total Length: %.2f s, Loop Length: %.2f s", vgmhdr->fileVer,
				player->Tick2Second(player->GetTotalTicks()), player->Tick2Second(player->GetLoopTicks()));
		mainPlr.SetLoopCount(vgmplay->GetModifiedLoopCount(maxLoops));
	}
	else if (player->GetPlayerType() == FCC_DRO)
	{
		DROPlayer* droplay = dynamic_cast<DROPlayer*>(player);
		const DRO_HEADER* drohdr = droplay->GetFileHeader();
		const char* hwType;
		
		if (drohdr->hwType == 0)
			hwType = "OPL2";
		else if (drohdr->hwType == 1)
			hwType = "DualOPL2";
		else if (drohdr->hwType == 2)
			hwType = "OPL3";
		else
			hwType = "unknown";
		printf("DRO v%u, Total Length: %.2f s, HW Type: %s", drohdr->verMajor,
				player->Tick2Second(player->GetTotalTicks()), hwType);
	}
	
	if (showTags > 0)
	{
		const char* songTitle = NULL;
		const char* songAuthor = NULL;
		const char* songGame = NULL;
		const char* songSystem = NULL;
		const char* songDate = NULL;
		const char* songComment = NULL;
	
		const char* const* tagList = player->GetTags();
		for (const char* const* t = tagList; *t; t += 2)
		{
			if (!strcmp(t[0], "TITLE"))
				songTitle = t[1];
			else if (!strcmp(t[0], "ARTIST"))
				songAuthor = t[1];
			else if (!strcmp(t[0], "GAME"))
				songGame = t[1];
			else if (!strcmp(t[0], "SYSTEM"))
				songSystem = t[1];
			else if (!strcmp(t[0], "DATE"))
				songDate = t[1];
			else if (!strcmp(t[0], "COMMENT"))
				songComment = t[1];
		}
		
		if (songTitle != NULL && songTitle[0] != '\0')
			printf("\nSong Title: %s", songTitle);
		if (showTags >= 2)
		{
			if (songAuthor != NULL && songAuthor[0] != '\0')
				printf("\nSong Author: %s", songAuthor);
			if (songGame != NULL && songGame[0] != '\0')
				printf("\nSong Game: %s", songGame);
			if (songSystem != NULL && songSystem[0] != '\0')
				printf("\nSong System: %s", songSystem);
			if (songDate != NULL && songDate[0] != '\0')
				printf("\nSong Date: %s", songDate);
			if (songComment != NULL && songComment[0] != '\0')
				printf("\nSong Comment: %s", songComment);
		}
	}
	
	putchar('\n');
	
	{
		PLR_DEV_OPTS devOpts;
		UINT32 devOptID;
		
		devOptID = PLR_DEV_ID(DEVID_SN76496, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[4] = {0x00, -0x80, +0x80, 0x00};
			if (! devOpts.emuCore[0])
				devOpts.emuCore[0] = FCC_MAXM;
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}
		
		devOptID = PLR_DEV_ID(DEVID_YM2413, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[14] = {
				-0x100, +0x100, -0x80, +0x80, -0x40, +0x40, -0xC0, +0xC0, 0x00,
				-0x60, +0x60, 0x00, -0xC0, +0xC0};
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}
		
		devOptID = PLR_DEV_ID(DEVID_AY8910, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[3] = {-0x80, +0x80, 0x00};
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}

		devOptID = PLR_DEV_ID(DEVID_C6280, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			if (! devOpts.emuCore[0])
				devOpts.emuCore[0] = FCC_MAME;
			player->SetDeviceOptions(devOptID, devOpts);
		}
	}
	
	mainPlr.Start();
	
	if (showFileInfo)
	{
		// only after calling PlayerA::Start() we can obtain info about the currently used sound cores
		PLR_SONG_INFO sInf;
		std::vector<PLR_DEV_INFO> diList;
		size_t curDev;
		
		player->GetSongInfo(sInf);
		player->GetSongDeviceInfo(diList);
		printf("SongInfo: %s v%X.%02X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",
			FCC2Str(sInf.format).c_str(), sInf.fileVerMaj, sInf.fileVerMin,
			sInf.tickRateMul, sInf.tickRateDiv, sInf.songLen, sInf.loopTick, sInf.deviceCnt);
		for (curDev = 0; curDev < diList.size(); curDev ++)
		{
			const PLR_DEV_INFO& pdi = diList[curDev];
			printf(" Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
				(int)pdi.id, pdi.type, (INT8)pdi.instance, FCC2Str(pdi.core).c_str(), pdi.devCfg->clock, pdi.smplRate, pdi.volume);
		}
	}
	const std::vector<VGMPlayer::DACSTRM_DEV>* vgmPcmStrms = NULL;
	if (player->GetPlayerType() == FCC_VGM)
	{
		VGMPlayer* vgmplay = dynamic_cast<VGMPlayer*>(player);
		vgmPcmStrms = &vgmplay->GetStreamDevInfo();
	}
	
	StartDiskWriter("waveOut.wav");
	
	if (audDrv != NULL)
		retVal = AudioDrv_SetCallback(audDrv, FillBuffer, &mainPlr);
	else
		retVal = 0xFF;
	manualRenderLoop = (retVal != 0x00);
#ifndef _WIN32
	changemode(1);
#endif
	playState &= ~PLAYSTATE_END;
	needRefresh = true;
	while(! (playState & PLAYSTATE_END))
	{
		if (! (playState & PLAYSTATE_PAUSE))
			needRefresh = true;	// always update when playing
		if (needRefresh)
		{
			const char* pState;
			
			if (playState & PLAYSTATE_PAUSE)
				pState = "Paused";
			else if (mainPlr.GetState() & PLAYSTATE_END)
				pState = "Finish ";
			else if (mainPlr.GetState() & PLAYSTATE_FADE)
				pState = "Fading ";
			else
				pState = "Playing";
			if (vgmPcmStrms == NULL || vgmPcmStrms->empty())
			{
				printf("%s %.2f / %.2f ...   \r", pState, mainPlr.GetCurTime(pbTimeMode), mainPlr.GetTotalTime(pbTimeMode));
			}
			else
			{
				const VGMPlayer::DACSTRM_DEV* strmDev = &(*vgmPcmStrms)[0];
				std::string pbMode = " ";
				if (strmDev->pbMode & 0x10)
					pbMode += 'R';	// reverse playback
				if (strmDev->pbMode & 0x80)
					pbMode += 'L';	// looping
				if (pbMode.length() == 1)
					pbMode = "";
				printf("%s %.2f / %.2f [%02X / %02X at %4.1f KHz%s] ...     \r",
					pState, mainPlr.GetCurTime(pbTimeMode), mainPlr.GetTotalTime(pbTimeMode),
					1 + strmDev->lastItem, strmDev->maxItems, strmDev->freq / 1000.0,
					pbMode.c_str());
			}
			fflush(stdout);
			needRefresh = false;
		}
		
		if (manualRenderLoop && ! (playState & PLAYSTATE_PAUSE))
		{
			UINT32 wrtBytes = FillBuffer(audDrvLog, &mainPlr, (UINT32)locAudBuf.size(), &locAudBuf[0]);
			AudioDrv_WriteData(audDrvLog, wrtBytes, &locAudBuf[0]);
		}
		else
		{
			Sleep(50);
		}
		
		if (_kbhit())
		{
			int inkey = _getch();
			int letter = toupper(inkey);
			
			if (letter == ' ' || letter == 'P')
			{
				playState ^= PLAYSTATE_PAUSE;
				if (audDrv != NULL)
				{
					if (playState & PLAYSTATE_PAUSE)
						AudioDrv_Pause(audDrv);
					else
						AudioDrv_Resume(audDrv);
				}
			}
			else if (letter == 'R')	// restart
			{
				OSMutex_Lock(renderMtx);
				mainPlr.Reset();
				OSMutex_Unlock(renderMtx);
			}
			else if (letter >= '0' && letter <= '9')
			{
				UINT32 maxPos;
				UINT8 pbPos10;
				UINT32 destPos;
				
				OSMutex_Lock(renderMtx);
				maxPos = mainPlr.GetPlayer()->GetTotalPlayTicks(maxLoops);
				pbPos10 = letter - '0';
				destPos = maxPos * pbPos10 / 10;
				mainPlr.Seek(PLAYPOS_TICK, destPos);
				OSMutex_Unlock(renderMtx);
			}
			else if (letter == 'B')	// previous file
			{
				if (curSong > argbase)
				{
					playState |= PLAYSTATE_END;
					curSong -= 2;
				}
			}
			else if (letter == 'N')	// next file
			{
				if (curSong + 1 < argc)
					playState |= PLAYSTATE_END;
			}
			else if (inkey == 0x1B || letter == 'Q')	// quit
			{
				playState |= PLAYSTATE_END;
				curSong = argc - 1;
			}
			else if (letter == 'F')	// fade out
			{
				OSMutex_Lock(renderMtx);
				mainPlr.FadeOut();
				OSMutex_Unlock(renderMtx);
			}
			else if (letter == 'C')	// chip control
			{
#ifndef _WIN32
				changemode(0);	// make sure entered charactered are echoed
#endif
				DoChipControlMode(mainPlr.GetPlayer());
#ifndef _WIN32
				changemode(1);
#endif
			}
			needRefresh = true;
		}
	}
#ifndef _WIN32
	changemode(0);
#endif
	// remove callback to prevent further rendering
	// also waits for render thread to finish its work
	if (audDrv != NULL)
		AudioDrv_SetCallback(audDrv, NULL, NULL);
	
	StopDiskWriter();
	
	mainPlr.Stop();
	mainPlr.UnloadFile();
	DataLoader_Deinit(dLoad);	dLoad = NULL;
#ifdef USE_MEMORY_LOADER
	free(fileData);
#endif
	
	}	// end for(curSong)
	
	mainPlr.UnregisterAllPlayers();
	
	StopAudioDevice();
	DeinitAudioSystem();
	printf("Done.\n");
	
#if defined(_DEBUG) && (_MSC_VER >= 1400)
	// doesn't work well with C++ containers
	//if (_CrtDumpMemoryLeaks())
	//	_getch();
#endif
	
	return 0;
}